

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_bool32 ma_dr_flac__read_and_seek_residual(ma_dr_flac_bs *bs,ma_uint32 blockSize,ma_uint32 order)

{
  uint uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ma_bool32 mVar6;
  ma_bool32 mVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ushort uVar12;
  int iVar13;
  ma_bool32 mVar14;
  ulong uVar15;
  ma_dr_flac_cache_t mVar16;
  uint uVar17;
  ma_uint32 mVar18;
  uint uVar19;
  uint uVar20;
  bool bVar21;
  ma_uint8 unencodedBitsPerSample;
  ma_uint8 partitionOrder;
  ma_uint8 residualMethod;
  ma_uint32 riceParamPlus1MaxConsumedBits;
  byte local_50;
  byte local_4f;
  byte local_4e;
  byte local_4d;
  uint local_4c;
  int local_48;
  byte local_41;
  uint local_40;
  uint local_3c;
  ulong local_38;
  
  mVar6 = ma_dr_flac__read_uint8(bs,2,&local_41);
  local_4e = local_41;
  mVar14 = 0;
  mVar7 = 0;
  if (((local_41 < 2 && mVar6 != 0) &&
      (mVar6 = ma_dr_flac__read_uint8(bs,4,&local_4d), mVar7 = mVar14, mVar6 != 0)) &&
     (local_4d < 9)) {
    local_40 = blockSize >> (local_4d & 0x1f);
    local_4c = local_40 - order;
    if (order <= local_40 && local_4c != 0) {
      local_48 = 1 << (local_4d & 0x1f);
      do {
        local_50 = 0;
        if ((local_4e & 1) == 0) {
          mVar7 = ma_dr_flac__read_uint8(bs,4,&local_50);
          if (mVar7 != 0) {
            bVar21 = local_50 == 0xf;
            goto LAB_001912f8;
          }
LAB_001918d8:
          iVar8 = 1;
        }
        else {
          mVar7 = ma_dr_flac__read_uint8(bs,5,&local_50);
          if (mVar7 == 0) goto LAB_001918d8;
          bVar21 = local_50 == 0x1f;
LAB_001912f8:
          if (bVar21) {
            local_50 = 0xff;
          }
          if (local_50 == 0xff) {
            local_4f = 0;
            mVar7 = ma_dr_flac__read_uint8(bs,5,&local_4f);
            if ((mVar7 == 0) ||
               (mVar7 = ma_dr_flac__seek_bits(bs,(ulong)(local_4f * local_4c)), mVar7 == 0))
            goto LAB_001918d8;
          }
          else if (local_4c != 0) {
            local_38 = (ulong)(local_50 + 1);
            local_3c = 0x3f - local_50;
            uVar17 = 0;
            do {
              uVar15 = bs->cache;
              mVar18 = bs->consumedBits;
              if (ma_dr_flac__gIsLZCNTSupported == 0) goto LAB_0019134d;
              uVar11 = LZCOUNT(uVar15);
              while (0x3f < (uint)uVar11) {
                uVar19 = bs->nextL2Line;
                if ((ulong)uVar19 < 0x200) {
                  uVar12 = bs->crc16;
                  uVar20 = (uint)uVar12;
                  if (bs->crc16CacheIgnoredBytes < 8) {
                    mVar16 = bs->crc16Cache;
                    uVar9 = (uint)mVar16;
                    uVar2 = (ushort)(mVar16 >> 0x30);
                    uVar3 = (uint)(mVar16 >> 0x10);
                    uVar1 = (uint)(mVar16 >> 0x18);
                    uVar4 = (uint)(mVar16 >> 0x20);
                    switch(bs->crc16CacheIgnoredBytes) {
                    case 0:
                      bs->crc16 = ma_dr_flac__crc16_table
                                  [((uint)ma_dr_flac__crc16_table
                                          [((uint)ma_dr_flac__crc16_table
                                                  [(uVar4 >> 8 ^
                                                   ((uint)ma_dr_flac__crc16_table
                                                          [(uint)(uVar12 >> 8) ^
                                                           (uint)(byte)(mVar16 >> 0x38)] << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [((uint)uVar2 ^
                                                          ((uint)uVar12 << 8 ^
                                                          (uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar12 >> 8) ^
                                                                 (uint)(byte)(mVar16 >> 0x38)]) >> 8
                                                          & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                           ^ (uint)ma_dr_flac__crc16_table
                                                   [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                                    [((uint)uVar2 ^
                                                                     ((uint)uVar12 << 8 ^
                                                                     (uint)ma_dr_flac__crc16_table
                                                                           [(uint)(uVar12 >> 8) ^
                                                                            (uint)(byte)(mVar16 >>
                                                                                        0x38)]) >> 8
                                                                     & 0xff) & 0xff] << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uVar4 >> 8 ^
                                                                    ((uint)ma_dr_flac__crc16_table
                                                                           [(uint)(uVar12 >> 8) ^
                                                                            (uint)(byte)(mVar16 >>
                                                                                        0x38)] << 8
                                                                    ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar12 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^
                                                   (uint)(byte)(mVar16 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff])
                                           >> 8 & 0xff ^ uVar1 & 0xff] << 8 ^ uVar9 ^
                                   (uint)ma_dr_flac__crc16_table
                                         [(((uint)ma_dr_flac__crc16_table
                                                  [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                                   [((uint)uVar2 ^
                                                                    ((uint)uVar12 << 8 ^
                                                                    (uint)ma_dr_flac__crc16_table
                                                                          [(uint)(uVar12 >> 8) ^
                                                                           (uint)(byte)(mVar16 >>
                                                                                       0x38)]) >> 8
                                                                    & 0xff) & 0xff] << 8 ^
                                                            (uint)ma_dr_flac__crc16_table
                                                                  [(uVar4 >> 8 ^
                                                                   ((uint)ma_dr_flac__crc16_table
                                                                          [(uint)(uVar12 >> 8) ^
                                                                           (uint)(byte)(mVar16 >>
                                                                                       0x38)] << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar12 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^
                                                   (uint)(byte)(mVar16 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                            << 8 ^ (uint)ma_dr_flac__crc16_table
                                                         [((uint)ma_dr_flac__crc16_table
                                                                 [(uVar4 >> 8 ^
                                                                  ((uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar12 >> 8) ^
                                                                          (uint)(byte)(mVar16 >>
                                                                                      0x38)] << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar12 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^
                                                   (uint)(byte)(mVar16 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar12 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^
                                                   (uint)(byte)(mVar16 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar4 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar12 >> 8) ^
                                                                 (uint)(byte)(mVar16 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar2 ^
                                                                  ((uint)uVar12 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar12 >> 8) ^
                                                                         (uint)(byte)(mVar16 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar1 & 0xff])
                                           >> 8 & 0xff ^ uVar3 & 0xffff) & 0xff]) >> 8 & 0xff] << 8
                                  ^ ma_dr_flac__crc16_table
                                    [(((uint)ma_dr_flac__crc16_table
                                             [(((uint)ma_dr_flac__crc16_table
                                                      [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar12 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^
                                                   (uint)(byte)(mVar16 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar4 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar12 >> 8) ^
                                                                 (uint)(byte)(mVar16 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar2 ^
                                                                  ((uint)uVar12 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar12 >> 8) ^
                                                                         (uint)(byte)(mVar16 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)ma_dr_flac__crc16_table
                                                             [(uVar4 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar12 >> 8) ^
                                                                      (uint)(byte)(mVar16 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar12 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^
                                                   (uint)(byte)(mVar16 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar12 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^
                                                   (uint)(byte)(mVar16 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar4 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar12 >> 8) ^
                                                                 (uint)(byte)(mVar16 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar2 ^
                                                                  ((uint)uVar12 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar12 >> 8) ^
                                                                         (uint)(byte)(mVar16 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar1 & 0xff])
                                               >> 8 & 0xff ^ uVar3 & 0xffff) & 0xff] << 8 ^
                                      (uint)ma_dr_flac__crc16_table
                                            [((uint)ma_dr_flac__crc16_table
                                                    [((uint)ma_dr_flac__crc16_table
                                                            [(uVar4 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar12 >> 8) ^
                                                                     (uint)(byte)(mVar16 >> 0x38)]
                                                              << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                           [((uint)uVar2 ^
                                                                            ((uint)uVar12 << 8 ^
                                                                            (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^
                                                   (uint)(byte)(mVar16 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar12 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^
                                                   (uint)(byte)(mVar16 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar4 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar12 >> 8) ^
                                                                 (uint)(byte)(mVar16 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar2 ^
                                                                  ((uint)uVar12 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar12 >> 8) ^
                                                                         (uint)(byte)(mVar16 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar1 & 0xff]
                                              << 8 ^ uVar9 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [(((uint)ma_dr_flac__crc16_table
                                                            [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                                             [((uint)uVar2 ^
                                                                              ((uint)uVar12 << 8 ^
                                                                              (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^
                                                   (uint)(byte)(mVar16 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar4 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar12 >> 8) ^
                                                                 (uint)(byte)(mVar16 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar2 ^
                                                                  ((uint)uVar12 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar12 >> 8) ^
                                                                         (uint)(byte)(mVar16 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)ma_dr_flac__crc16_table
                                                                [(uVar4 >> 8 ^
                                                                 ((uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar12 >> 8) ^
                                                                         (uint)(byte)(mVar16 >> 0x38
                                                                                     )] << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar12 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^
                                                   (uint)(byte)(mVar16 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar4 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar12 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^
                                                   (uint)(byte)(mVar16 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar4 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar12 >> 8) ^
                                                                 (uint)(byte)(mVar16 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar2 ^
                                                                  ((uint)uVar12 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar12 >> 8) ^
                                                                         (uint)(byte)(mVar16 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar1 & 0xff])
                                                  >> 8 & 0xff ^ uVar3 & 0xffff) & 0xff]) >> 8 & 0xff
                                            ]) >> 8 & 0xff ^ uVar9) & 0xff];
                      break;
                    case 1:
                      uVar20 = (uint)(ushort)(uVar12 << 8 ^
                                             ma_dr_flac__crc16_table
                                             [(ushort)(uVar2 ^ uVar12 >> 8) & 0xff]);
                    case 2:
                      uVar20 = (uint)(ushort)((ushort)(uVar20 << 8) ^
                                             ma_dr_flac__crc16_table[(uVar4 ^ uVar20) >> 8 & 0xff]);
                    case 3:
                      uVar20 = (uint)(ushort)((ushort)(uVar20 << 8) ^
                                             ma_dr_flac__crc16_table[(uVar4 ^ uVar20 >> 8) & 0xff]);
                    case 4:
                      uVar20 = (uint)(ushort)((ushort)(uVar20 << 8) ^
                                             ma_dr_flac__crc16_table[uVar20 >> 8 ^ uVar1 & 0xff]);
                    case 5:
                      uVar20 = (uint)(ushort)((ushort)(uVar20 << 8) ^
                                             ma_dr_flac__crc16_table
                                             [(uVar20 >> 8 ^ uVar3 & 0xffff) & 0xff]);
                    case 6:
                      uVar12 = (ushort)(uVar20 << 8) ^
                               ma_dr_flac__crc16_table[(uVar9 ^ uVar20) >> 8 & 0xff];
                    case 7:
                      uVar12 = uVar12 << 8 ^ ma_dr_flac__crc16_table[(uVar9 ^ uVar12 >> 8) & 0xff];
                      goto LAB_001915d9;
                    }
                  }
                  else {
LAB_001915d9:
                    bs->crc16 = uVar12;
                    bs->crc16CacheIgnoredBytes = 0;
                  }
                  bs->nextL2Line = uVar19 + 1;
                  uVar15 = bs->cacheL2[uVar19];
                  uVar15 = uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 |
                           (uVar15 & 0xff0000000000) >> 0x18 | (uVar15 & 0xff00000000) >> 8 |
                           (uVar15 & 0xff000000) << 8 | (uVar15 & 0xff0000) << 0x18 |
                           (uVar15 & 0xff00) << 0x28 | uVar15 << 0x38;
                  bs->crc16Cache = uVar15;
                  mVar18 = 0;
                }
                else {
                  mVar7 = ma_dr_flac__reload_cache(bs);
                  if (mVar7 == 0) goto LAB_001918d8;
                  uVar15 = bs->cache;
                  mVar18 = bs->consumedBits;
                }
                if (ma_dr_flac__gIsLZCNTSupported == 0) {
LAB_0019134d:
                  if (uVar15 == 0) {
                    uVar11 = 0x40;
                  }
                  else {
                    if (uVar15 < 0x1000000000000000) {
                      bVar21 = uVar15 >> 0x20 == 0;
                      uVar11 = uVar15 << 0x20;
                      if (!bVar21) {
                        uVar11 = uVar15;
                      }
                      iVar13 = (uint)bVar21 * 0x20;
                      iVar8 = iVar13 + 0x10;
                      uVar5 = uVar11 << 0x10;
                      if (0xffffffffffff < uVar11) {
                        iVar8 = iVar13;
                        uVar5 = uVar11;
                      }
                      iVar13 = iVar8 + 8;
                      uVar11 = uVar5 << 8;
                      if (0xffffffffffffff < uVar5) {
                        iVar13 = iVar8;
                        uVar11 = uVar5;
                      }
                      iVar8 = iVar13 + 4;
                      uVar5 = uVar11 << 4;
                      if (0xfffffffffffffff < uVar11) {
                        iVar8 = iVar13;
                        uVar5 = uVar11;
                      }
                      iVar8 = iVar8 + *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::
                                               clz_table_4 + (uVar5 >> 0x3c) * 4);
                    }
                    else {
                      iVar8 = *(int *)(ma_dr_flac__clz_software(unsigned_long_long)::clz_table_4 +
                                      (uVar15 >> 0x3c) * 4);
                    }
                    uVar11 = (ulong)(iVar8 - 1);
                  }
                }
                else {
                  uVar11 = LZCOUNT(uVar15);
                }
              }
              mVar16 = uVar15 << ((byte)uVar11 & 0x3f);
              uVar19 = mVar18 + (uint)uVar11;
              uVar20 = uVar19 - local_3c;
              if (uVar19 < local_3c || uVar20 == 0) {
                mVar16 = mVar16 << ((byte)local_38 & 0x3f);
                uVar19 = uVar19 + (int)local_38;
              }
              else {
                uVar1 = bs->nextL2Line;
                if ((ulong)uVar1 < 0x200) {
                  uVar12 = bs->crc16;
                  uVar19 = (uint)uVar12;
                  if (bs->crc16CacheIgnoredBytes < 8) {
                    mVar16 = bs->crc16Cache;
                    uVar10 = (uint)mVar16;
                    uVar2 = (ushort)(mVar16 >> 0x30);
                    uVar4 = (uint)(mVar16 >> 0x10);
                    uVar3 = (uint)(mVar16 >> 0x18);
                    uVar9 = (uint)(mVar16 >> 0x20);
                    switch(bs->crc16CacheIgnoredBytes) {
                    case 0:
                      bs->crc16 = ma_dr_flac__crc16_table
                                  [((uint)ma_dr_flac__crc16_table
                                          [((uint)ma_dr_flac__crc16_table
                                                  [(uVar9 >> 8 ^
                                                   ((uint)ma_dr_flac__crc16_table
                                                          [(uint)(uVar12 >> 8) ^
                                                           (uint)(byte)(mVar16 >> 0x38)] << 8 ^
                                                   (uint)ma_dr_flac__crc16_table
                                                         [((uint)uVar2 ^
                                                          ((uint)uVar12 << 8 ^
                                                          (uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar12 >> 8) ^
                                                                 (uint)(byte)(mVar16 >> 0x38)]) >> 8
                                                          & 0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8
                                           ^ (uint)ma_dr_flac__crc16_table
                                                   [(uVar9 ^ ((uint)ma_dr_flac__crc16_table
                                                                    [((uint)uVar2 ^
                                                                     ((uint)uVar12 << 8 ^
                                                                     (uint)ma_dr_flac__crc16_table
                                                                           [(uint)(uVar12 >> 8) ^
                                                                            (uint)(byte)(mVar16 >>
                                                                                        0x38)]) >> 8
                                                                     & 0xff) & 0xff] << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uVar9 >> 8 ^
                                                                    ((uint)ma_dr_flac__crc16_table
                                                                           [(uint)(uVar12 >> 8) ^
                                                                            (uint)(byte)(mVar16 >>
                                                                                        0x38)] << 8
                                                                    ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar12 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^
                                                   (uint)(byte)(mVar16 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff])
                                           >> 8 & 0xff ^ uVar3 & 0xff] << 8 ^ uVar10 ^
                                   (uint)ma_dr_flac__crc16_table
                                         [(((uint)ma_dr_flac__crc16_table
                                                  [(uVar9 ^ ((uint)ma_dr_flac__crc16_table
                                                                   [((uint)uVar2 ^
                                                                    ((uint)uVar12 << 8 ^
                                                                    (uint)ma_dr_flac__crc16_table
                                                                          [(uint)(uVar12 >> 8) ^
                                                                           (uint)(byte)(mVar16 >>
                                                                                       0x38)]) >> 8
                                                                    & 0xff) & 0xff] << 8 ^
                                                            (uint)ma_dr_flac__crc16_table
                                                                  [(uVar9 >> 8 ^
                                                                   ((uint)ma_dr_flac__crc16_table
                                                                          [(uint)(uVar12 >> 8) ^
                                                                           (uint)(byte)(mVar16 >>
                                                                                       0x38)] << 8 ^
                                                                   (uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar12 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^
                                                   (uint)(byte)(mVar16 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                            << 8 ^ (uint)ma_dr_flac__crc16_table
                                                         [((uint)ma_dr_flac__crc16_table
                                                                 [(uVar9 >> 8 ^
                                                                  ((uint)ma_dr_flac__crc16_table
                                                                         [(uint)(uVar12 >> 8) ^
                                                                          (uint)(byte)(mVar16 >>
                                                                                      0x38)] << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar2 ^
                                                                         ((uint)uVar12 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^
                                                   (uint)(byte)(mVar16 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar9 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar12 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^
                                                   (uint)(byte)(mVar16 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar9 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar12 >> 8) ^
                                                                 (uint)(byte)(mVar16 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar2 ^
                                                                  ((uint)uVar12 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar12 >> 8) ^
                                                                         (uint)(byte)(mVar16 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar3 & 0xff])
                                           >> 8 & 0xff ^ uVar4 & 0xffff) & 0xff]) >> 8 & 0xff] << 8
                                  ^ ma_dr_flac__crc16_table
                                    [(((uint)ma_dr_flac__crc16_table
                                             [(((uint)ma_dr_flac__crc16_table
                                                      [(uVar9 ^ ((uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar12 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^
                                                   (uint)(byte)(mVar16 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar9 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar12 >> 8) ^
                                                                 (uint)(byte)(mVar16 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar2 ^
                                                                  ((uint)uVar12 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar12 >> 8) ^
                                                                         (uint)(byte)(mVar16 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)ma_dr_flac__crc16_table
                                                             [(uVar9 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar12 >> 8) ^
                                                                      (uint)(byte)(mVar16 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar2 ^
                                                                             ((uint)uVar12 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^
                                                   (uint)(byte)(mVar16 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar9 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar12 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^
                                                   (uint)(byte)(mVar16 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar9 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar12 >> 8) ^
                                                                 (uint)(byte)(mVar16 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar2 ^
                                                                  ((uint)uVar12 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar12 >> 8) ^
                                                                         (uint)(byte)(mVar16 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar3 & 0xff])
                                               >> 8 & 0xff ^ uVar4 & 0xffff) & 0xff] << 8 ^
                                      (uint)ma_dr_flac__crc16_table
                                            [((uint)ma_dr_flac__crc16_table
                                                    [((uint)ma_dr_flac__crc16_table
                                                            [(uVar9 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar12 >> 8) ^
                                                                     (uint)(byte)(mVar16 >> 0x38)]
                                                              << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                           [((uint)uVar2 ^
                                                                            ((uint)uVar12 << 8 ^
                                                                            (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^
                                                   (uint)(byte)(mVar16 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar9 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar12 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^
                                                   (uint)(byte)(mVar16 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar9 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar12 >> 8) ^
                                                                 (uint)(byte)(mVar16 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar2 ^
                                                                  ((uint)uVar12 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar12 >> 8) ^
                                                                         (uint)(byte)(mVar16 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar3 & 0xff]
                                              << 8 ^ uVar10 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [(((uint)ma_dr_flac__crc16_table
                                                            [(uVar9 ^ ((uint)ma_dr_flac__crc16_table
                                                                             [((uint)uVar2 ^
                                                                              ((uint)uVar12 << 8 ^
                                                                              (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^
                                                   (uint)(byte)(mVar16 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar9 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar12 >> 8) ^
                                                                 (uint)(byte)(mVar16 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar2 ^
                                                                  ((uint)uVar12 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar12 >> 8) ^
                                                                         (uint)(byte)(mVar16 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [((uint)ma_dr_flac__crc16_table
                                                                [(uVar9 >> 8 ^
                                                                 ((uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar12 >> 8) ^
                                                                         (uint)(byte)(mVar16 >> 0x38
                                                                                     )] << 8 ^
                                                                 (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar2 ^
                                                                        ((uint)uVar12 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^
                                                   (uint)(byte)(mVar16 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar9 ^ ((uint)ma_dr_flac__crc16_table
                                                                         [((uint)uVar2 ^
                                                                          ((uint)uVar12 << 8 ^
                                                                          (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar12 >> 8) ^
                                                   (uint)(byte)(mVar16 >> 0x38)]) >> 8 & 0xff) &
                                                  0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar9 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar12 >> 8) ^
                                                                 (uint)(byte)(mVar16 >> 0x38)] << 8
                                                         ^ (uint)ma_dr_flac__crc16_table
                                                                 [((uint)uVar2 ^
                                                                  ((uint)uVar12 << 8 ^
                                                                  (uint)ma_dr_flac__crc16_table
                                                                        [(uint)(uVar12 >> 8) ^
                                                                         (uint)(byte)(mVar16 >> 0x38
                                                                                     )]) >> 8 & 0xff
                                                                  ) & 0xff]) >> 8 & 0xff) & 0xff])
                                                  >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar3 & 0xff])
                                                  >> 8 & 0xff ^ uVar4 & 0xffff) & 0xff]) >> 8 & 0xff
                                            ]) >> 8 & 0xff ^ uVar10) & 0xff];
                      break;
                    case 1:
                      uVar19 = (uint)(ushort)(uVar12 << 8 ^
                                             ma_dr_flac__crc16_table
                                             [(ushort)(uVar2 ^ uVar12 >> 8) & 0xff]);
                    case 2:
                      uVar19 = (uint)(ushort)((ushort)(uVar19 << 8) ^
                                             ma_dr_flac__crc16_table[(uVar9 ^ uVar19) >> 8 & 0xff]);
                    case 3:
                      uVar19 = (uint)(ushort)((ushort)(uVar19 << 8) ^
                                             ma_dr_flac__crc16_table[(uVar9 ^ uVar19 >> 8) & 0xff]);
                    case 4:
                      uVar19 = (uint)(ushort)((ushort)(uVar19 << 8) ^
                                             ma_dr_flac__crc16_table[uVar19 >> 8 ^ uVar3 & 0xff]);
                    case 5:
                      uVar19 = (uint)(ushort)((ushort)(uVar19 << 8) ^
                                             ma_dr_flac__crc16_table
                                             [(uVar19 >> 8 ^ uVar4 & 0xffff) & 0xff]);
                    case 6:
                      uVar12 = (ushort)(uVar19 << 8) ^
                               ma_dr_flac__crc16_table[(uVar10 ^ uVar19) >> 8 & 0xff];
                    case 7:
                      uVar12 = uVar12 << 8 ^ ma_dr_flac__crc16_table[(uVar10 ^ uVar12 >> 8) & 0xff];
                      goto LAB_00191834;
                    }
                  }
                  else {
LAB_00191834:
                    bs->crc16 = uVar12;
                    bs->crc16CacheIgnoredBytes = 0;
                  }
                  bs->nextL2Line = uVar1 + 1;
                  uVar15 = bs->cacheL2[uVar1];
                  uVar15 = uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 |
                           (uVar15 & 0xff0000000000) >> 0x18 | (uVar15 & 0xff00000000) >> 8 |
                           (uVar15 & 0xff000000) << 8 | (uVar15 & 0xff0000) << 0x18 |
                           (uVar15 & 0xff00) << 0x28 | uVar15 << 0x38;
                  bs->crc16Cache = uVar15;
                  uVar19 = uVar20;
LAB_00191860:
                  mVar16 = uVar15 << ((byte)uVar20 & 0x3f);
                  bVar21 = true;
                }
                else {
                  mVar7 = ma_dr_flac__reload_cache(bs);
                  if ((mVar7 != 0) && ((ulong)uVar20 <= 0x40 - (ulong)bs->consumedBits)) {
                    uVar15 = bs->cache;
                    uVar19 = bs->consumedBits + uVar20;
                    goto LAB_00191860;
                  }
                  bVar21 = false;
                }
                if (!bVar21) goto LAB_001918d8;
              }
              bs->cache = mVar16;
              bs->consumedBits = uVar19;
              uVar17 = uVar17 + 1;
            } while (uVar17 != local_4c);
          }
          if (local_48 == 1) {
            iVar8 = 2;
            local_48 = 1;
          }
          else {
            local_48 = local_48 + -1;
            iVar8 = 0;
            local_4c = local_40;
          }
        }
      } while (iVar8 == 0);
      mVar7 = 0;
      if (iVar8 == 2) {
        mVar7 = 1;
      }
    }
  }
  return mVar7;
}

Assistant:

static ma_bool32 ma_dr_flac__read_and_seek_residual(ma_dr_flac_bs* bs, ma_uint32 blockSize, ma_uint32 order)
{
    ma_uint8 residualMethod;
    ma_uint8 partitionOrder;
    ma_uint32 samplesInPartition;
    ma_uint32 partitionsRemaining;
    MA_DR_FLAC_ASSERT(bs != NULL);
    MA_DR_FLAC_ASSERT(blockSize != 0);
    if (!ma_dr_flac__read_uint8(bs, 2, &residualMethod)) {
        return MA_FALSE;
    }
    if (residualMethod != MA_DR_FLAC_RESIDUAL_CODING_METHOD_PARTITIONED_RICE && residualMethod != MA_DR_FLAC_RESIDUAL_CODING_METHOD_PARTITIONED_RICE2) {
        return MA_FALSE;
    }
    if (!ma_dr_flac__read_uint8(bs, 4, &partitionOrder)) {
        return MA_FALSE;
    }
    if (partitionOrder > 8) {
        return MA_FALSE;
    }
    if ((blockSize / (1 << partitionOrder)) <= order) {
        return MA_FALSE;
    }
    samplesInPartition = (blockSize / (1 << partitionOrder)) - order;
    partitionsRemaining = (1 << partitionOrder);
    for (;;)
    {
        ma_uint8 riceParam = 0;
        if (residualMethod == MA_DR_FLAC_RESIDUAL_CODING_METHOD_PARTITIONED_RICE) {
            if (!ma_dr_flac__read_uint8(bs, 4, &riceParam)) {
                return MA_FALSE;
            }
            if (riceParam == 15) {
                riceParam = 0xFF;
            }
        } else if (residualMethod == MA_DR_FLAC_RESIDUAL_CODING_METHOD_PARTITIONED_RICE2) {
            if (!ma_dr_flac__read_uint8(bs, 5, &riceParam)) {
                return MA_FALSE;
            }
            if (riceParam == 31) {
                riceParam = 0xFF;
            }
        }
        if (riceParam != 0xFF) {
            if (!ma_dr_flac__read_and_seek_residual__rice(bs, samplesInPartition, riceParam)) {
                return MA_FALSE;
            }
        } else {
            ma_uint8 unencodedBitsPerSample = 0;
            if (!ma_dr_flac__read_uint8(bs, 5, &unencodedBitsPerSample)) {
                return MA_FALSE;
            }
            if (!ma_dr_flac__seek_bits(bs, unencodedBitsPerSample * samplesInPartition)) {
                return MA_FALSE;
            }
        }
        if (partitionsRemaining == 1) {
            break;
        }
        partitionsRemaining -= 1;
        samplesInPartition = blockSize / (1 << partitionOrder);
    }
    return MA_TRUE;
}